

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O3

void __thiscall
OpenMD::SimpleTypeData<OpenMD::EAMParameters>::SimpleTypeData
          (SimpleTypeData<OpenMD::EAMParameters> *this,string *id,EAMParameters *data)

{
  pointer pcVar1;
  
  GenericData::GenericData(&this->super_GenericData,id);
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__SimpleTypeData_00302190;
  (this->data_).eamType = data->eamType;
  (this->data_).latticeType._M_dataplus._M_p = (pointer)&(this->data_).latticeType.field_2;
  pcVar1 = (data->latticeType)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->data_).latticeType,pcVar1,
             pcVar1 + (data->latticeType)._M_string_length);
  (this->data_).latticeConstant = data->latticeConstant;
  return;
}

Assistant:

SimpleTypeData(const std::string& id, const ElemDataType& data) :
        GenericData(id), data_(data) {}